

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void dtranspose(double *sig,int rows,int cols,double *col)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  
  uVar3 = cols;
  if (rows < cols) {
    uVar3 = rows;
  }
  iVar4 = 1 - rows;
  if (iVar4 < cols) {
    iVar5 = rows * iVar4;
    iVar7 = rows + -1;
    iVar11 = cols * iVar7;
    uVar10 = 0;
    do {
      if (iVar4 < 1) {
        uVar10 = uVar10 + 1;
        if ((int)uVar3 <= (int)uVar10) {
          uVar10 = uVar3;
        }
        uVar9 = (ulong)uVar10;
        pdVar6 = sig;
        iVar8 = iVar7;
        iVar2 = iVar11;
        if (0 < (int)uVar10) {
          do {
            col[iVar8] = pdVar6[iVar2];
            uVar9 = uVar9 - 1;
            pdVar6 = pdVar6 + 1;
            iVar8 = iVar8 + rows + 1;
            iVar2 = iVar2 + cols;
          } while (uVar9 != 0);
        }
      }
      else {
        uVar1 = uVar10 - 1;
        if ((int)uVar3 < (int)uVar10) {
          uVar1 = uVar3;
        }
        if ((rows - cols) + iVar4 < 1) {
          uVar1 = uVar10;
        }
        uVar10 = uVar1;
        uVar9 = (ulong)uVar10;
        pdVar6 = col;
        iVar2 = iVar5;
        iVar8 = iVar4;
        if (0 < (int)uVar10) {
          do {
            pdVar6[iVar2] = sig[iVar8];
            uVar9 = uVar9 - 1;
            pdVar6 = pdVar6 + 1;
            iVar2 = iVar2 + rows;
            iVar8 = iVar8 + cols + 1;
          } while (uVar9 != 0);
        }
      }
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + rows;
      iVar11 = iVar11 - cols;
      iVar7 = iVar7 + -1;
    } while (iVar4 != cols);
  }
  return;
}

Assistant:

void dtranspose(double *sig, int rows, int cols,double *col) {
    int max,ud,i,k;
    if (rows >= cols) {
    	max = cols;
    } else {
    	max = rows;
    }
    ud = 0;
	for (i= -rows + 1; i < cols; i++) {
		if (i <= 0) {
			ud++;
			if (ud >= max)
				ud = max;
			for (k = 0; k < ud; k++) {
				col[k*rows+k-i] = sig[(k-i)*cols+k];
			}
		} else {
			if (i - cols + rows > 0) {
				ud--;
				if (ud >= max)
					ud = max;
			}
			for (k = 0; k < ud; k++) {
				col[(k+i)*rows+k] = sig[k*cols+k+i];
			}
		}

	}

}